

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaSetValidOptions(xmlSchemaValidCtxtPtr ctxt,int options)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = -1;
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    uVar2 = 1;
    do {
      if (((uint)options >> (uVar2 & 0x1f) & 1) != 0) {
        return -1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x20);
    ctxt->options = options;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlSchemaSetValidOptions(xmlSchemaValidCtxtPtr ctxt,
			 int options)

{
    int i;

    if (ctxt == NULL)
	return (-1);
    /*
    * WARNING: Change the start value if adding to the
    * xmlSchemaValidOption.
    * TODO: Is there an other, more easy to maintain,
    * way?
    */
    for (i = 1; i < (int) sizeof(int) * 8; i++) {
        if (options & 1<<i)
	    return (-1);
    }
    ctxt->options = options;
    return (0);
}